

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

bool anon_unknown.dwarf_71625::findPoint<float>
               (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *second,
               vector<float,_std::allocator<float>_> *edge,uint32_t leftSideOffset,
               uint32_t rightSideOffset,int minimumContrast,bool checkContrast,
               uint32_t leftSideContrastCheck,uint32_t rightSideContrastCheck,uint32_t position,
               uint32_t size)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first_01;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first_02;
  reference piVar1;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_R9D;
  float fVar3;
  undefined1 auVar5 [16];
  undefined4 uVar4;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  byte in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  uint in_stack_00000020;
  uint in_stack_00000028;
  float sumWhite;
  float sumBlack;
  uint32_t whiteContrastEnd;
  uint32_t blackContrastStart;
  uint32_t whiteContrastStart;
  uint32_t blackContrastEnd;
  int minIntensity;
  int maxIntensity;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffed8
  ;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int local_6c;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int local_34;
  byte local_2d;
  int local_2c;
  vector<int,_std::allocator<int>_> *local_18;
  bool local_1;
  undefined1 extraout_var [60];
  
  auVar6 = in_ZMM0._0_16_;
  local_2d = in_stack_00000008 & 1;
  local_2c = in_R9D;
  local_18 = in_RSI;
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffec8._M_current);
  local_48 = (int *)__gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffed8,
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffec8._M_current);
  local_60 = (int *)__gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffed8,
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_58 = (int *)__gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffed8,
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  __first_01._M_current._4_4_ = in_stack_fffffffffffffeec;
  __first_01._M_current._0_4_ = in_stack_fffffffffffffee8;
  __last._M_current._4_4_ = in_stack_fffffffffffffee4;
  __last._M_current._0_4_ = in_stack_fffffffffffffee0;
  local_40 = std::
             max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       (__first_01,__last);
  piVar1 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_40);
  local_34 = *piVar1;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffed8,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
            );
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffed8,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
            );
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffed8,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
            );
  __first_02._M_current._4_4_ = in_stack_fffffffffffffeec;
  __first_02._M_current._0_4_ = in_stack_fffffffffffffee8;
  __last_00._M_current._4_4_ = in_stack_fffffffffffffee4;
  __last_00._M_current._0_4_ = in_stack_fffffffffffffee0;
  local_78 = std::
             min_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       (__first_02,__last_00);
  piVar1 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_78);
  local_6c = *piVar1;
  if (local_34 - local_6c < local_2c) {
    local_1 = false;
  }
  else {
    if ((((local_2d & 1) != 0) && (in_stack_00000010 <= in_stack_00000020)) &&
       (in_stack_00000018 + in_stack_00000020 < in_stack_00000028)) {
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      __first._M_current._4_4_ = in_stack_fffffffffffffed4;
      __first._M_current._0_4_ = in_stack_fffffffffffffed0;
      fVar3 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                        (__first,in_stack_fffffffffffffec8,0.0);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      __first_00._M_current._4_4_ = in_stack_fffffffffffffed4;
      __first_00._M_current._0_4_ = in_stack_fffffffffffffed0;
      auVar7._0_4_ = std::
                     accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                               (__first_00,in_stack_fffffffffffffec8,0.0);
      auVar7._4_60_ = extraout_var;
      auVar6 = vcvtusi2ss_avx512f(auVar7._0_16_,in_stack_00000010 + 1);
      auVar5._0_4_ = fVar3 / auVar6._0_4_;
      auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar6 = vcvtusi2ss_avx512f(auVar5,in_stack_00000018);
      fVar3 = auVar7._0_4_ / auVar6._0_4_ - auVar5._0_4_;
      auVar6 = ZEXT416((uint)fVar3);
      if ((float)local_2c <= fVar3) {
        local_2d = 0;
      }
    }
    if ((local_2d & 1) == 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)in_stack_00000020)
      ;
      vVar8 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_18,(ulong)(in_stack_00000020 + 1));
      if (vVar8 == *pvVar2) {
        vcvtusi2ss_avx512f(auVar6,in_stack_00000020);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (value_type_conflict5 *)in_stack_fffffffffffffec8._M_current);
      }
      else {
        auVar6 = vcvtusi2ss_avx512f(auVar6,in_stack_00000020);
        uVar4 = auVar6._0_4_;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_18,(ulong)in_stack_00000020);
        fVar3 = (float)*pvVar2;
        std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)in_stack_00000020);
        std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)(in_stack_00000020 + 1));
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)CONCAT44(uVar4,fVar3),
                   (value_type_conflict5 *)in_stack_fffffffffffffec8._M_current);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool findPoint( const std::vector< int > & data, const std::vector< int > & second, std::vector< _Type > & edge,
                    uint32_t leftSideOffset, uint32_t rightSideOffset, int minimumContrast, bool checkContrast,
                    uint32_t leftSideContrastCheck, uint32_t rightSideContrastCheck, uint32_t position, uint32_t size )
    {
        const int maxIntensity = *(std::max_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));
        const int minIntensity = *(std::min_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));

        if ( maxIntensity - minIntensity < minimumContrast )
            return false;

        if ( checkContrast && leftSideContrastCheck <= position && (rightSideContrastCheck + position) < size ) {
            const uint32_t blackContrastEnd   = position;
            const uint32_t whiteContrastStart = position + 1;

            const uint32_t blackContrastStart = position - leftSideContrastCheck;
            const uint32_t whiteContrastEnd   = position + rightSideContrastCheck;

            _Type sumBlack = std::accumulate( data.begin() + blackContrastStart, data.begin() + blackContrastEnd + 1, 0.0f );
            _Type sumWhite = std::accumulate( data.begin() + whiteContrastStart, data.begin() + whiteContrastEnd + 1, 0.0f );

            sumBlack /= (blackContrastEnd - blackContrastStart + 1);
            sumWhite /= (whiteContrastEnd - whiteContrastStart + 1);

            if ( sumWhite - sumBlack >= minimumContrast )
                checkContrast = false;
        }

        if ( !checkContrast ) {
            if ( second[position] != second[position + 1] )
                edge.push_back( position + static_cast<_Type>(second[position]) / (second[position] - second[position + 1u]) );
            else
                edge.push_back( position + 0.5f );
            return true;
        }

        return false;
    }